

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_completions.cc
# Opt level: O0

string * gflags::anon_unknown_2::GetShortFlagLine
                   (string *__return_storage_ptr__,string *line_indentation,
                   CommandLineFlagInfo *info)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  char *pcVar6;
  undefined8 uVar7;
  char *pcVar8;
  char *local_108;
  bool local_ba;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  undefined1 local_78 [8];
  string suffix;
  int remainder;
  undefined1 local_40 [7];
  bool is_string;
  string prefix;
  CommandLineFlagInfo *info_local;
  string *line_indentation_local;
  
  prefix.field_2._8_8_ = info;
  std::__cxx11::string::string((string *)local_40);
  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (prefix.field_2._8_8_ + 0x20),"string");
  uVar4 = std::__cxx11::string::c_str();
  uVar5 = std::__cxx11::string::c_str();
  pcVar6 = "";
  if (bVar1) {
    pcVar6 = "\'";
  }
  uVar7 = std::__cxx11::string::c_str();
  pcVar8 = "";
  if (bVar1) {
    pcVar8 = "\'";
  }
  SStringPrintf((string *)local_40,"%s--%s [%s%s%s] ",uVar4,uVar5,pcVar6,uVar7,pcVar8);
  iVar3 = fLI::FLAGS_tab_completion_columns;
  iVar2 = std::__cxx11::string::size();
  suffix.field_2._8_4_ = iVar3 - iVar2;
  std::__cxx11::string::string((string *)local_78);
  if (0 < (int)suffix.field_2._8_4_) {
    iVar3 = std::__cxx11::string::size();
    local_ba = iVar3 <= (int)suffix.field_2._8_4_;
    if (local_ba) {
      local_108 = (char *)std::__cxx11::string::c_str();
    }
    else {
      std::__cxx11::string::substr((ulong)&local_b8,prefix.field_2._8_8_ + 0x40);
      std::operator+(&local_98,&local_b8,"...");
      local_108 = (char *)std::__cxx11::string::c_str();
    }
    local_ba = !local_ba;
    std::__cxx11::string::operator=((string *)local_78,local_108);
    if (local_ba) {
      std::__cxx11::string::~string((string *)&local_98);
      std::__cxx11::string::~string((string *)&local_b8);
    }
  }
  std::operator+(__return_storage_ptr__,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

static string GetShortFlagLine(
    const string &line_indentation,
    const CommandLineFlagInfo &info) {
  string prefix;
  bool is_string = (info.type == "string");
  SStringPrintf(&prefix, "%s--%s [%s%s%s] ",
                line_indentation.c_str(),
                info.name.c_str(),
                (is_string ? "'" : ""),
                info.default_value.c_str(),
                (is_string ? "'" : ""));
  int remainder =
      FLAGS_tab_completion_columns - static_cast<int>(prefix.size());
  string suffix;
  if (remainder > 0)
    suffix =
        (static_cast<int>(info.description.size()) > remainder ?
         (info.description.substr(0, remainder - 3) + "...").c_str() :
         info.description.c_str());
  return prefix + suffix;
}